

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void CreatePropertyGeneratorExpressions
               (cmStringRange entries,cmBacktraceRange backtraces,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *items,bool evaluateForBuildsystem)

{
  pointer *pppTVar1;
  iterator __position;
  auto_ptr<cmCompiledGeneratorExpression> aVar2;
  const_iterator backtrace;
  const_iterator cVar3;
  undefined3 in_register_00000089;
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> local_78;
  cmGeneratorExpression local_70;
  string local_50;
  
  local_70.Backtrace.Bottom.Position.Tree._4_4_ =
       CONCAT31(in_register_00000089,evaluateForBuildsystem);
  backtrace = backtraces.Begin._M_current;
  local_70.Backtrace.Cur = (Entry *)entries.End._M_current;
  cVar3 = entries.Begin._M_current;
  if ((Entry *)cVar3._M_current != local_70.Backtrace.Cur) {
    do {
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)&local_50,backtrace._M_current);
      cmGeneratorExpression::Parse(&local_70,&local_50);
      local_78.x_ = (cmCompiledGeneratorExpression *)local_70.Backtrace.Bottom.State;
      local_70.Backtrace.Bottom.State = (cmState *)0x0;
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_70);
      aVar2.x_ = local_78.x_;
      (local_78.x_)->EvaluateForBuildsystem = SUB41(local_70.Backtrace.Bottom.Position.Tree._4_4_,0)
      ;
      local_70.Backtrace.Bottom.State = (cmState *)operator_new(0x10);
      local_78.x_ = (cmCompiledGeneratorExpression *)0x0;
      local_70.Backtrace.Bottom.Position.Position = 0;
      (((cmListFileBacktrace *)&(local_70.Backtrace.Bottom.State)->PropertyDefinitions)->Bottom).
      State = (cmState *)aVar2.x_;
      *(cmLinkImplItem **)
       &((local_70.Backtrace.Bottom.State)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header.
        _M_header = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
      __position._M_current =
           (items->
           super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (items->
          super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
        ::_M_realloc_insert<cmGeneratorTarget::TargetPropertyEntry*>
                  ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
                    *)items,__position,(TargetPropertyEntry **)&local_70);
      }
      else {
        *__position._M_current = (TargetPropertyEntry *)local_70.Backtrace.Bottom.State;
        pppTVar1 = &(items->
                    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)
                 &local_70.Backtrace.Bottom.Position.Position);
      cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_78);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_50);
      cVar3._M_current = cVar3._M_current + 1;
      backtrace._M_current = backtrace._M_current + 1;
    } while ((Entry *)cVar3._M_current != local_70.Backtrace.Cur);
  }
  return;
}

Assistant:

void CreatePropertyGeneratorExpressions(
  cmStringRange entries, cmBacktraceRange backtraces,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& items,
  bool evaluateForBuildsystem = false)
{
  std::vector<cmListFileBacktrace>::const_iterator btIt = backtraces.begin();
  for (std::vector<std::string>::const_iterator it = entries.begin();
       it != entries.end(); ++it, ++btIt) {
    cmGeneratorExpression ge(*btIt);
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*it);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    items.push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
  }
}